

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

void __thiscall
ThreadedReplayer::mark_currently_active_modules
          (ThreadedReplayer *this,VkPipelineShaderStageCreateInfo *stages,uint32_t count)

{
  mapped_type *pmVar1;
  VkShaderModule local_38;
  VkShaderModule module;
  PerThreadData *pPStack_28;
  uint i;
  PerThreadData *per_thread;
  VkPipelineShaderStageCreateInfo *pVStack_18;
  uint32_t count_local;
  VkPipelineShaderStageCreateInfo *stages_local;
  ThreadedReplayer *this_local;
  
  if ((this->robustness & 1U) != 0) {
    per_thread._4_4_ = count;
    pVStack_18 = stages;
    stages_local = (VkPipelineShaderStageCreateInfo *)this;
    pPStack_28 = get_per_thread_data(this);
    pPStack_28->num_failed_module_hashes = per_thread._4_4_;
    for (module._4_4_ = 0; module._4_4_ < per_thread._4_4_; module._4_4_ = module._4_4_ + 1) {
      local_38 = pVStack_18[module._4_4_].module;
      pmVar1 = std::
               unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
               ::operator[](&this->shader_module_to_hash,&local_38);
      pPStack_28->failed_module_hashes[module._4_4_] = *pmVar1;
    }
  }
  return;
}

Assistant:

void mark_currently_active_modules(const VkPipelineShaderStageCreateInfo *stages, uint32_t count)
	{
		if (robustness)
		{
			auto &per_thread = get_per_thread_data();
			per_thread.num_failed_module_hashes = count;
			for (unsigned i = 0; i < count; i++)
			{
				VkShaderModule module = stages[i].module;
				per_thread.failed_module_hashes[i] = shader_module_to_hash[module];
			}
		}
	}